

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkIdUsed(CheckerVisitor *this,Id *id,Node *p,ValueRef *v)

{
  _func_int **pp_Var1;
  byte bVar2;
  bool bVar3;
  TreeOp TVar4;
  Id *pIVar5;
  SQChar *pSVar6;
  CheckerVisitor *in_RCX;
  ExprStatement *in_RDX;
  Id *in_RSI;
  CheckerVisitor *in_RDI;
  bool used;
  bool simpleAsgn;
  Expr *rhs;
  Expr *lhs;
  BinExpr *bin;
  bool assigned;
  Expr *e;
  bool local_5b;
  bool local_5a;
  bool local_59;
  undefined7 in_stack_ffffffffffffffd0;
  BinExpr *this_00;
  BinExpr *this_01;
  
  this_00 = (BinExpr *)0x0;
  if (in_RDX != (ExprStatement *)0x0) {
    TVar4 = Node::op((Node *)in_RDX);
    if (TVar4 == TO_EXPR_STMT) {
      this_00 = (BinExpr *)ExprStatement::expression(in_RDX);
    }
    else {
      bVar3 = Node::isExpression((Node *)in_RDX);
      if (bVar3) {
        this_00 = (BinExpr *)Node::asExpression((Node *)in_RDX);
      }
    }
  }
  bVar2 = *(byte *)((long)&in_RCX->_ctx + 4) & 1;
  if ((this_00 != (BinExpr *)0x0) && (bVar3 = isAssignExpr((Expr *)0x187c1a), bVar3)) {
    this_01 = this_00;
    pIVar5 = (Id *)BinExpr::lhs(this_00);
    BinExpr::rhs(this_00);
    TVar4 = Node::op((Node *)this_01);
    this_00 = this_01;
    if (in_RSI == pIVar5) {
      local_59 = true;
      if ((*(byte *)((long)(in_RCX->super_Visitor)._vptr_Visitor + 0xe) & 1) == 0) {
        local_59 = existsInTree(in_RCX,&this_01->super_Expr,
                                (Expr *)CONCAT17(bVar2,in_stack_ffffffffffffffd0));
      }
      pp_Var1 = (in_RCX->super_Visitor)._vptr_Visitor;
      *(bool *)((long)pp_Var1 + 0xd) =
           (*(byte *)((long)pp_Var1 + 0xd) & 1) != 0 || local_59 != false;
      *(undefined1 *)((long)&in_RCX->_ctx + 4) = 1;
      *(VarScope **)&in_RCX->field_0x20 = in_RDI->currentScope;
      *(undefined1 *)((long)(in_RCX->super_Visitor)._vptr_Visitor + 0xe) = 0;
      this_00 = this_01;
      if (TVar4 == TO_ASSIGN) {
        return;
      }
    }
  }
  *(undefined1 *)((long)(in_RCX->super_Visitor)._vptr_Visitor + 0xd) = 1;
  if ((bVar2 & 1) != 0) {
    *(undefined1 *)((long)(in_RCX->super_Visitor)._vptr_Visitor + 0xe) = 1;
    if (this_00 == (BinExpr *)0x0) {
      local_5b = false;
    }
    else {
      TVar4 = Node::op((Node *)this_00);
      local_5a = false;
      if (0x2b < (int)TVar4) {
        TVar4 = Node::op((Node *)this_00);
        local_5a = (int)TVar4 < 0x31;
      }
      local_5b = local_5a;
    }
    *(bool *)((long)&in_RCX->_ctx + 4) = local_5b;
  }
  if (in_RCX->functionComplexityThreshold == 5) {
    pSVar6 = Id::id(in_RSI);
    report(in_RDI,(Node *)in_RSI,0x85,pSVar6);
  }
  else if (in_RCX->functionComplexityThreshold == 0) {
    report(in_RDI,(Node *)in_RSI,0x86);
  }
  return;
}

Assistant:

void CheckerVisitor::checkIdUsed(const Id *id, const Node *p, ValueRef *v) {
  const Expr *e = nullptr;
  if (p) {
    if (p->op() == TO_EXPR_STMT)
      e = static_cast<const ExprStatement *>(p)->expression();
    else if (p->isExpression())
      e = p->asExpression();
  }

  bool assigned = v->assigned;

  if (e && isAssignExpr(e)) {
    const BinExpr *bin = static_cast<const BinExpr *>(e);
    const Expr *lhs = bin->lhs();
    Expr *rhs = bin->rhs();
    bool simpleAsgn = e->op() == TO_ASSIGN;
    if (id == lhs) {
      bool used = v->info->usedAfterAssign || existsInTree(id, rhs);
      //if (!used && assigned && simpleAsgn) {
      //  if (!v->lastAssigneeScope || currentScope->owner == v->lastAssigneeScope->owner)
      //    report(bin, DiagnosticsId::DI_REASSIGN_WITH_NO_USAGE);
      //}
      v->info->used |= used;
      v->assigned = true;
      v->lastAssigneeScope = currentScope;
      v->info->usedAfterAssign = false;
      if (simpleAsgn)
        return;
    }
  }

  // it's usage
  v->info->used = true;
  if (assigned) {
    v->info->usedAfterAssign = true;
    v->assigned = e ? TO_PLUSEQ <= e->op() && e->op() <= TO_MODEQ : false;
  }

  if (v->state == VRS_PARTIALLY) {
    report(id, DiagnosticsId::DI_POSSIBLE_GARBAGE, id->id());
  }
  else if (v->state == VRS_UNDEFINED) {
    report(id, DiagnosticsId::DI_UNINITIALIZED_VAR);
  }
}